

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>
::DataNode<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
          (DataNode<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           *this,Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *map,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<> *args_2)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar1;
  BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_4UL,_16384UL>
  *in_RDI;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffa8;
  undefined1 local_38 [56];
  
  ppVar1 = BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_4UL,_16384UL>
           ::allocate(in_RDI);
  in_RDI->mHead = ppVar1;
  ppVar1 = in_RDI->mHead;
  std::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  tuple((tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)in_RDI,in_stack_ffffffffffffffa8);
  pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::pair<std::__cxx11::string_const&>(ppVar1,local_38);
  return;
}

Assistant:

explicit DataNode(M& map, Args&&... args)
            : mData(map.allocate()) {
            ::new (static_cast<void*>(mData)) value_type(std::forward<Args>(args)...);
        }